

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

void __thiscall
dg::vr::ValueRelations::set<dg::vr::Bucket,llvm::ConstantInt_const*>
          (ValueRelations *this,Bucket *lt,Relations rels,ConstantInt **rt)

{
  bool bVar1;
  ConstantInt **in_stack_00000018;
  Type in_stack_00000024;
  Bucket *in_stack_00000028;
  ValueRelations *in_stack_00000030;
  Relations other;
  Type rel;
  undefined1 in_stack_ffffffffffffff9b;
  Type in_stack_ffffffffffffff9c;
  Relations *in_stack_ffffffffffffffa0;
  Relations *in_stack_ffffffffffffffa8;
  byte local_41;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  bitset<12UL> local_30;
  undefined4 local_24;
  
  local_24 = dg::vr::Relations::get();
  set<dg::vr::Bucket,llvm::ConstantInt_const*>
            (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018);
  memset(local_38,0,8);
  Relations::Relations((Relations *)0x1d7a93);
  Relations::ult((Relations *)0x1d7a9d);
  Relations::ule((Relations *)0x1d7aa5);
  Relations::ugt((Relations *)0x1d7aad);
  Relations::uge((Relations *)0x1d7ab5);
  local_30.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)operator&(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  bVar1 = Relations::any((Relations *)0x1d7ad1);
  local_41 = 0;
  if (bVar1) {
    memset(local_40,0,8);
    Relations::Relations((Relations *)0x1d7afb);
    Relations::set(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                   (bool)in_stack_ffffffffffffff9b);
    dg::vr::Relations::addImplied();
    dg::vr::Relations::get();
    bVar1 = Relations::has(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    local_41 = bVar1 ^ 0xff;
  }
  if ((local_41 & 1) != 0) {
    dg::vr::Relations::get();
    set<dg::vr::Bucket,llvm::ConstantInt_const*>
              (in_stack_00000030,in_stack_00000028,in_stack_00000024,in_stack_00000018);
  }
  return;
}

Assistant:

void set(const X &lt, Relations rels, const Y &rt) {
        Relations::Type rel = rels.get();
        set(lt, rel, rt);
        Relations other = rels & Relations().ult().ule().ugt().uge();
        if (other.any() && !Relations().set(rel).addImplied().has(other.get()))
            set(lt, other.get(), rt);
    }